

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Point2f phyr::uniformSampleDisk(Point2f *pt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Point2f PVar4;
  
  dVar1 = pt->x;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar2 = pt->y * 6.283185307179586;
  dVar3 = cos(dVar2);
  PVar4.x = dVar3 * dVar1;
  dVar2 = sin(dVar2);
  PVar4.y = dVar1 * dVar2;
  return PVar4;
}

Assistant:

Point2f uniformSampleDisk(const Point2f& pt) {
    Real rad = std::sqrt(pt.x);
    Real theta = 2 * Pi * pt.y;
    return Point2f(rad * std::cos(theta), rad * std::sin(theta));
}